

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall CaDiCaL::LratChecker::dump(LratChecker *this)

{
  int iVar1;
  long in_RDI;
  uint i_3;
  LratCheckerClause *c_1;
  uint64_t i_2;
  uint i_1;
  LratCheckerClause *c;
  uint64_t i;
  int max_var;
  uint local_3c;
  undefined8 *local_38;
  ulong local_30;
  uint local_24;
  undefined8 *local_20;
  ulong local_18;
  uint local_c;
  
  local_c = 0;
  for (local_18 = 0; local_18 < *(ulong *)(in_RDI + 0xd8); local_18 = local_18 + 1) {
    for (local_20 = *(undefined8 **)(*(long *)(in_RDI + 0xe0) + local_18 * 8);
        local_20 != (undefined8 *)0x0; local_20 = (undefined8 *)*local_20) {
      for (local_24 = 0; local_24 < *(uint *)((long)local_20 + 0x1c); local_24 = local_24 + 1) {
        iVar1 = *(int *)((long)local_20 + (ulong)local_24 * 4 + 0x24);
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        if ((int)local_c < iVar1) {
          local_c = *(uint *)((long)local_20 + (ulong)local_24 * 4 + 0x24);
          if ((int)local_c < 1) {
            local_c = -local_c;
          }
        }
      }
    }
  }
  printf("p cnf %d %lu\n",(ulong)local_c,*(undefined8 *)(in_RDI + 0xc0));
  for (local_30 = 0; local_30 < *(ulong *)(in_RDI + 0xd8); local_30 = local_30 + 1) {
    for (local_38 = *(undefined8 **)(*(long *)(in_RDI + 0xe0) + local_30 * 8);
        local_38 != (undefined8 *)0x0; local_38 = (undefined8 *)*local_38) {
      for (local_3c = 0; local_3c < *(uint *)((long)local_38 + 0x1c); local_3c = local_3c + 1) {
        printf("%d ",(ulong)*(uint *)((long)local_38 + (ulong)local_3c * 4 + 0x24));
      }
      printf("0\n");
    }
  }
  return;
}

Assistant:

void LratChecker::dump () {
  int max_var = 0;
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next)
      for (unsigned i = 0; i < c->size; i++)
        if (abs (c->literals[i]) > max_var)
          max_var = abs (c->literals[i]);
  printf ("p cnf %d %" PRIu64 "\n", max_var, num_clauses);
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next) {
      for (unsigned i = 0; i < c->size; i++)
        printf ("%d ", c->literals[i]);
      printf ("0\n");
    }
}